

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QObject_const*,QList<QCss::StyleRule>>::emplace_helper<QList<QCss::StyleRule>>
          (QHash<QObject_const*,QList<QCss::StyleRule>> *this,QObject **key,
          QList<QCss::StyleRule> *args)

{
  piter pVar1;
  Node<const_QObject_*,_QList<QCss::StyleRule>_> *n;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>>::
  findOrInsert<QObject_const*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>> **)this,key);
  n = (Node<const_QObject_*,_QList<QCss::StyleRule>_> *)
      ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
      (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
      [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>::createInPlace<QList<QCss::StyleRule>>
              (n,key,args);
  }
  else {
    QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>::emplaceValue<QList<QCss::StyleRule>>
              ((Node<QObject_const*,QList<QCss::StyleRule>> *)n,args);
  }
  pVar1.bucket = local_38._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }